

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockMetadata_Linear::PrintDetailedMap(VmaBlockMetadata_Linear *this,VmaJsonWriter *json)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  VkDeviceSize unusedRangeSize;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void **ppvVar11;
  long lVar12;
  VmaBlockMetadata_Linear *this_00;
  size_t sVar13;
  void *pvVar14;
  long lVar15;
  VmaSuballocation *pVVar16;
  ulong uVar17;
  VmaSuballocation *pVVar18;
  bool bVar19;
  bool bVar20;
  
  uVar1 = (this->super_VmaBlockMetadata).m_Size;
  bVar19 = this->m_1stVectorIndex == 0;
  bVar3 = !bVar19;
  uVar10 = (&this->m_Suballocations0)[bVar19].m_Count;
  uVar6 = this->m_1stNullItemsBeginCount;
  uVar9 = uVar1;
  if (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    uVar2 = (&this->m_Suballocations0)[bVar3].m_pArray[uVar6].offset;
    if (uVar2 == 0) {
      bVar20 = false;
      sVar13 = 0;
      lVar5 = 0;
      uVar7 = 0;
      lVar4 = 0;
      goto LAB_001b792a;
    }
    sVar13 = 0;
    lVar5 = 0;
    lVar4 = 0;
    uVar8 = 0;
    uVar17 = 0;
    do {
      if (uVar10 <= uVar8) {
LAB_001b78f3:
        sVar13 = sVar13 + 1;
        uVar7 = uVar2;
        break;
      }
      ppvVar11 = &(&this->m_Suballocations0)[bVar19].m_pArray[uVar8].userData;
      while (uVar8 = uVar8 + 1, *ppvVar11 == (void *)0x0) {
        ppvVar11 = ppvVar11 + 4;
        if (uVar8 == uVar10) goto LAB_001b78f3;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + (long)ppvVar11[-1];
      uVar7 = (long)ppvVar11[-1] + ((VmaSuballocation *)(ppvVar11 + -2))->offset;
      sVar13 = sVar13 + (uVar17 < ((VmaSuballocation *)(ppvVar11 + -2))->offset);
      uVar17 = uVar7;
    } while (uVar7 < uVar2);
  }
  else {
    lVar4 = 0;
    uVar7 = 0;
    lVar5 = 0;
    sVar13 = 0;
  }
  bVar20 = this->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK;
  if (bVar20) {
    uVar9 = (&this->m_Suballocations0)[bVar19].m_pArray[uVar10 - 1].offset;
  }
LAB_001b792a:
  uVar2 = (&this->m_Suballocations0)[bVar3].m_Count;
  if (uVar7 < uVar9) {
    lVar12 = 0;
    uVar17 = uVar7;
    do {
      if (uVar2 <= uVar6) {
LAB_001b79ab:
        sVar13 = sVar13 + (uVar17 < uVar1);
        uVar7 = uVar9;
        break;
      }
      ppvVar11 = &(&this->m_Suballocations0)[bVar3].m_pArray[uVar6].userData;
      while (uVar6 = uVar6 + 1, *ppvVar11 == (void *)0x0) {
        ppvVar11 = ppvVar11 + 4;
        if (uVar6 == uVar2) goto LAB_001b79ab;
      }
      lVar12 = lVar12 + 1;
      lVar5 = lVar5 + (long)ppvVar11[-1];
      uVar7 = (long)ppvVar11[-1] + ((VmaSuballocation *)(ppvVar11 + -2))->offset;
      sVar13 = sVar13 + (uVar17 < ((VmaSuballocation *)(ppvVar11 + -2))->offset);
      uVar17 = uVar7;
    } while (uVar7 < uVar9);
  }
  else {
    lVar12 = 0;
  }
  uVar6 = uVar10;
  if ((bool)(bVar20 & uVar7 < uVar1)) {
    do {
      if (uVar6 == 0) {
LAB_001b7a29:
        sVar13 = sVar13 + 1;
        break;
      }
      lVar15 = 1 - uVar6;
      ppvVar11 = &(&this->m_Suballocations0)[bVar19].m_pArray[uVar6 - 1].userData;
      while (*ppvVar11 == (void *)0x0) {
        lVar15 = lVar15 + 1;
        ppvVar11 = ppvVar11 + -4;
        if (lVar15 == 1) goto LAB_001b7a29;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + (long)ppvVar11[-1];
      uVar17 = (long)ppvVar11[-1] + ((VmaSuballocation *)(ppvVar11 + -2))->offset;
      sVar13 = sVar13 + (uVar7 < ((VmaSuballocation *)(ppvVar11 + -2))->offset);
      uVar6 = -lVar15;
      uVar7 = uVar17;
    } while (uVar17 < uVar1);
  }
  this_00 = this;
  VmaBlockMetadata::PrintDetailedMap_Begin
            (&this->super_VmaBlockMetadata,json,uVar1 - lVar5,lVar4 + lVar12,sVar13);
  if ((this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) &&
     (uVar6 = (&this->m_Suballocations0)[bVar3].m_pArray[this->m_1stNullItemsBeginCount].offset,
     uVar6 != 0)) {
    uVar7 = 0;
    uVar17 = 0;
    do {
      if (uVar10 <= uVar17) {
LAB_001b7b0f:
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar6 - uVar7);
        uVar7 = uVar6;
        break;
      }
      pVVar16 = (&this->m_Suballocations0)[bVar19].m_pArray + uVar17;
      while( true ) {
        uVar17 = uVar17 + 1;
        pvVar14 = pVVar16->userData;
        if (pvVar14 != (void *)0x0) break;
        pVVar16 = pVVar16 + 1;
        if (uVar17 == uVar10) goto LAB_001b7b0f;
      }
      uVar8 = pVVar16->offset;
      if (uVar7 <= uVar8 && uVar8 - uVar7 != 0) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar8 - uVar7);
        uVar8 = pVVar16->offset;
        pvVar14 = pVVar16->userData;
      }
      this_00 = this;
      VmaBlockMetadata::PrintDetailedMap_Allocation
                (&this->super_VmaBlockMetadata,json,uVar8,pVVar16->size,pvVar14);
      uVar7 = pVVar16->size + pVVar16->offset;
    } while (uVar7 < uVar6);
  }
  else {
    uVar7 = 0;
  }
  if (uVar7 < uVar9) {
    uVar10 = this->m_1stNullItemsBeginCount;
    do {
      if (uVar2 <= uVar10) {
LAB_001b7bc0:
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar9 - uVar7);
        uVar7 = uVar9;
        break;
      }
      pVVar16 = (&this->m_Suballocations0)[bVar3].m_pArray + uVar10;
      while( true ) {
        uVar10 = uVar10 + 1;
        pvVar14 = pVVar16->userData;
        if (pvVar14 != (void *)0x0) break;
        pVVar16 = pVVar16 + 1;
        if (uVar10 == uVar2) goto LAB_001b7bc0;
      }
      uVar6 = pVVar16->offset;
      if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar6 - uVar7);
        uVar6 = pVVar16->offset;
        pvVar14 = pVVar16->userData;
      }
      this_00 = this;
      VmaBlockMetadata::PrintDetailedMap_Allocation
                (&this->super_VmaBlockMetadata,json,uVar6,pVVar16->size,pvVar14);
      uVar7 = pVVar16->size + pVVar16->offset;
    } while (uVar7 < uVar9);
  }
  if ((this->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) && (uVar7 < uVar1)) {
    sVar13 = (&this->m_Suballocations0)[bVar19].m_Count;
    do {
      if (sVar13 == 0) {
LAB_001b7c6a:
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar1 - uVar7);
        break;
      }
      lVar5 = 1 - sVar13;
      pVVar16 = (&this->m_Suballocations0)[bVar19].m_pArray + sVar13;
      while( true ) {
        pVVar18 = pVVar16 + -1;
        pvVar14 = pVVar16[-1].userData;
        if (pvVar14 != (void *)0x0) break;
        lVar5 = lVar5 + 1;
        pVVar16 = pVVar18;
        if (lVar5 == 1) goto LAB_001b7c6a;
      }
      uVar10 = pVVar18->offset;
      if (uVar7 <= uVar10 && uVar10 - uVar7 != 0) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&this_00->super_VmaBlockMetadata,json,uVar7,uVar10 - uVar7);
        uVar10 = pVVar18->offset;
        pvVar14 = pVVar16[-1].userData;
      }
      sVar13 = -lVar5;
      this_00 = this;
      VmaBlockMetadata::PrintDetailedMap_Allocation
                (&this->super_VmaBlockMetadata,json,uVar10,pVVar16[-1].size,pvVar14);
      uVar7 = pVVar16[-1].size + pVVar18->offset;
    } while (uVar7 < uVar1);
  }
  VmaJsonWriter::EndArray(json);
  return;
}

Assistant:

void VmaBlockMetadata_Linear::PrintDetailedMap(class VmaJsonWriter& json) const
{
    const VkDeviceSize size = GetSize();
    const SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    const SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
    const size_t suballoc1stCount = suballocations1st.size();
    const size_t suballoc2ndCount = suballocations2nd.size();

    // FIRST PASS

    size_t unusedRangeCount = 0;
    VkDeviceSize usedBytes = 0;

    VkDeviceSize lastOffset = 0;

    size_t alloc2ndCount = 0;
    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    size_t nextAlloc1stIndex = m_1stNullItemsBeginCount;
    size_t alloc1stCount = 0;
    const VkDeviceSize freeSpace1stTo2ndEnd =
        m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK ? suballocations2nd.back().offset : size;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                ++unusedRangeCount;
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            ++alloc1stCount;
            usedBytes += suballoc.size;

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < size)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                ++unusedRangeCount;
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    const VkDeviceSize unusedBytes = size - usedBytes;
    PrintDetailedMap_Begin(json, unusedBytes, alloc1stCount + alloc2ndCount, unusedRangeCount);

    // SECOND PASS
    lastOffset = 0;

    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    const VkDeviceSize unusedRangeSize = freeSpace2ndTo1stEnd - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    nextAlloc1stIndex = m_1stNullItemsBeginCount;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < freeSpace1stTo2ndEnd)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                const VkDeviceSize unusedRangeSize = freeSpace1stTo2ndEnd - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    const VkDeviceSize unusedRangeSize = size - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    PrintDetailedMap_End(json);
}